

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O2

int __thiscall GF2::WW<66UL>::Compare(WW<66UL> *this,WW<66UL> *wRight)

{
  word *pwVar1;
  word *pwVar2;
  size_t pos;
  long lVar3;
  
  lVar3 = 1;
  while( true ) {
    if (lVar3 == -1) {
      return 0;
    }
    pwVar1 = this->_words + lVar3;
    pwVar2 = wRight->_words + lVar3;
    if (*pwVar2 < *pwVar1) break;
    lVar3 = lVar3 + -1;
    if (*pwVar1 < *pwVar2) {
      return -1;
    }
  }
  return 1;
}

Assistant:

int Compare(const WW& wRight) const
	{
		for (size_t pos = _wcount - 1; pos != SIZE_MAX; --pos)
			if (_words[pos] > wRight._words[pos]) 
				return 1;
			else if (_words[pos] < wRight._words[pos]) 
				return -1;
		return 0;
	}